

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O1

int mbedtls_asn1_get_alg_null(uchar **p,uchar *end,mbedtls_asn1_buf *alg)

{
  int iVar1;
  int iVar2;
  mbedtls_asn1_buf params;
  mbedtls_asn1_buf local_18;
  
  local_18.tag = 0;
  local_18._4_4_ = 0;
  local_18.len = 0;
  local_18.p = (uchar *)0x0;
  iVar1 = mbedtls_asn1_get_alg(p,end,alg,&local_18);
  if (iVar1 == 0) {
    iVar2 = 0;
    if (local_18.len != 0) {
      iVar2 = -0x68;
    }
    iVar1 = -0x68;
    if (local_18.tag == 0) {
      iVar1 = iVar2;
    }
    if (local_18.tag == 5) {
      iVar1 = iVar2;
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_asn1_get_alg_null(unsigned char **p,
                              const unsigned char *end,
                              mbedtls_asn1_buf *alg)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_asn1_buf params;

    memset(&params, 0, sizeof(mbedtls_asn1_buf));

    if ((ret = mbedtls_asn1_get_alg(p, end, alg, &params)) != 0) {
        return ret;
    }

    if ((params.tag != MBEDTLS_ASN1_NULL && params.tag != 0) || params.len != 0) {
        return MBEDTLS_ERR_ASN1_INVALID_DATA;
    }

    return 0;
}